

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O2

bool anon_unknown.dwarf_1d7349::checkPixels<float>
               (Array2D<float> *ph,int lx,int rx,int ly,int ry,int width)

{
  ostream *poVar1;
  float *pfVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  
  lVar4 = (long)ly;
  lVar6 = lVar4 * 4;
  pfVar2 = ph->_data + ph->_sizeY * lVar4;
  iVar5 = ly * width;
  do {
    lVar7 = (long)lx;
    if (ry < lVar4) {
LAB_0017466e:
      return ry < lVar4;
    }
    for (; lVar7 <= rx; lVar7 = lVar7 + 1) {
      iVar3 = (iVar5 + (int)lVar7) % 0x801;
      fVar8 = (float)iVar3;
      if ((pfVar2[lVar7] != fVar8) || (NAN(pfVar2[lVar7]) || NAN(fVar8))) {
        poVar1 = std::operator<<((ostream *)&std::cout,"value at ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar7);
        poVar1 = std::operator<<(poVar1,", ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar4);
        poVar1 = std::operator<<(poVar1,": ");
        poVar1 = (ostream *)
                 std::ostream::operator<<
                           (poVar1,*(float *)((long)ph->_data + lVar7 * 4 + lVar6 * ph->_sizeY));
        poVar1 = std::operator<<(poVar1,", should be ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar3);
        std::endl<char,std::char_traits<char>>(poVar1);
        std::ostream::flush();
        goto LAB_0017466e;
      }
    }
    lVar4 = lVar4 + 1;
    lVar6 = lVar6 + 4;
    pfVar2 = pfVar2 + ph->_sizeY;
    iVar5 = iVar5 + width;
  } while( true );
}

Assistant:

bool
checkPixels (Array2D<T>& ph, int lx, int rx, int ly, int ry, int width)
{
    for (int y = ly; y <= ry; ++y)
    {
        for (int x = lx; x <= rx; ++x)
        {
            if (ph[y][x] != static_cast<T> (((y * width + x) % 2049)))
            {
                cout << "value at " << x << ", " << y << ": " << ph[y][x]
                     << ", should be " << (y * width + x) % 2049 << endl
                     << flush;
                return false;
            }
        }
    }

    return true;
}